

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

void loguru::file_close(void *user_data)

{
  FILE *file;
  
  if (user_data == (void *)0x0) {
    return;
  }
  fclose((FILE *)user_data);
  return;
}

Assistant:

void file_close(void* user_data)
	{
		FILE* file = to_file(user_data);
		if (file) {
			fclose(file);
		}
#if LOGURU_WITH_FILEABS
		delete reinterpret_cast<FileAbs*>(user_data);
#endif
	}